

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

Labeldesc * findlabel(LexState *ls,TString *name)

{
  Labeldesc *pLVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = (long)ls->fs->firstlabel;
  lVar3 = lVar2 + -1;
  lVar2 = lVar2 * 0x18 + -0x18;
  do {
    lVar4 = lVar2;
    lVar3 = lVar3 + 1;
    if ((ls->dyd->label).n <= lVar3) {
      return (Labeldesc *)0x0;
    }
    pLVar1 = (ls->dyd->label).arr;
    lVar2 = lVar4 + 0x18;
  } while (*(TString **)((long)&pLVar1[1].name + lVar4) != name);
  return (Labeldesc *)((long)&pLVar1[1].name + lVar4);
}

Assistant:

static Labeldesc *findlabel (LexState *ls, TString *name) {
  int i;
  Dyndata *dyd = ls->dyd;
  /* check labels in current function for a match */
  for (i = ls->fs->firstlabel; i < dyd->label.n; i++) {
    Labeldesc *lb = &dyd->label.arr[i];
    if (eqstr(lb->name, name))  /* correct label? */
      return lb;
  }
  return NULL;  /* label not found */
}